

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O1

void __thiscall
adios2::format::DataManSerializer::JsonToVarMap(DataManSerializer *this,json *metaJ,VecPtr *pack)

{
  value_t vVar1;
  uint uVar2;
  json_value jVar3;
  pointer puVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar8;
  bool bVar9;
  int iVar10;
  key_type *pkVar11;
  uint *puVar12;
  _Hash_node_base *p_Var13;
  reference pvVar14;
  __node_base_ptr p_Var15;
  mapped_type *pmVar16;
  reference pbVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  ulonglong uVar18;
  const_reference pvVar19;
  long lVar20;
  pointer pbVar21;
  mapped_type *pmVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  ostream *poVar24;
  undefined8 uVar25;
  string sVar26;
  vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_> *__tmp;
  ulong uVar27;
  pthread_mutex_t *__mutex;
  __node_base_ptr p_Var28;
  __node_base *p_Var29;
  const_iterator result_3;
  const_iterator itJson;
  size_t step;
  const_iterator it;
  iterator stepMapIt;
  ScopedTimer __var2173;
  iterator __end4;
  iterator rankMapIt;
  iterator result;
  iterator __begin4;
  undefined1 local_378 [8];
  iterator iStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Base_ptr local_358;
  size_t local_350;
  DataManSerializer *local_340;
  const_iterator local_338;
  reference local_310;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_308;
  _Hash_node_base *local_300;
  const_iterator local_2f8;
  iterator local_2d8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2b8;
  pthread_mutex_t *local_2a8;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_2a0;
  pthread_mutex_t *local_298;
  pthread_mutex_t *local_290;
  pthread_mutex_t *local_288;
  VecPtr *local_280;
  ScopedTimer local_278;
  unsigned_long local_270;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_268;
  iterator local_248;
  undefined1 local_228 [80];
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  DataType local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  _Base_ptr p_Stack_188;
  pointer local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_178;
  _Base_ptr local_170;
  pointer pbStack_168;
  ulonglong local_148;
  unsigned_long local_140;
  char *local_138;
  int local_130;
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 auStack_e8 [16];
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  _Base_ptr p_Stack_c8;
  size_t local_c0;
  element_type *peStack_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0 [2];
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  *local_a0;
  _func_int **local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_78;
  iterator local_70 [2];
  
  local_340 = this;
  local_310 = metaJ;
  local_280 = pack;
  if (JsonToVarMap(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,std::shared_ptr<std::vector<char,std::allocator<char>>>)
      ::__var173 == '\0') goto LAB_00683512;
  do {
    local_278.m_timer = JsonToVarMap::__var173;
    if (_perfstubs_initialized == 1) {
      ps_timer_start_();
    }
    local_2a8 = (pthread_mutex_t *)&this->m_DataManVarMapMutex;
    iVar10 = pthread_mutex_lock(local_2a8);
    if (iVar10 != 0) {
      std::__throw_system_error(iVar10);
    }
    this->m_CombiningSteps = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::begin(&local_2d8,local_310);
    local_288 = (pthread_mutex_t *)&this->m_DeserializedBlocksForStepMutex;
    local_2a0 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->m_DeserializedBlocksForStep;
    local_78 = &local_190;
    local_80 = &local_f8;
    local_90 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)auStack_e8;
    local_290 = (pthread_mutex_t *)&this->m_StaticDataJsonMutex;
    local_a0 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&this->m_StaticDataJson;
    local_98 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00886c10;
    local_88 = &(local_280->
                super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount;
    local_308 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->m_DataManVarMap;
    local_298 = (pthread_mutex_t *)&this->m_TimeStampsMutex;
LAB_00681e97:
    local_228._0_8_ = local_310;
    local_228._24_8_ = (pointer)0x8000000000000000;
    local_228._16_8_ = (_Base_ptr)0x0;
    local_228._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    if (local_310->m_type == array) {
      local_228._16_8_ =
           (((local_310->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (local_310->m_type == object) {
      local_228._8_8_ = &(((local_310->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_228._24_8_ = (pointer)0x1;
    }
    bVar9 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_2d8,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_228);
    if (bVar9) {
      if (4 < this->m_Verbosity) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"DataManSerializer::JsonToVarMap Total buffered steps = ",
                   0x37);
        poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar24,": ",2);
        p_Var29 = &(this->m_DataManVarMap)._M_h._M_before_begin;
        while (p_Var29 = p_Var29->_M_nxt, p_Var29 != (__node_base *)0x0) {
          poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24,", ",2);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
      }
      pthread_mutex_unlock(local_2a8);
      external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_278);
      return;
    }
    pkVar11 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::key(&local_2d8);
    iVar10 = std::__cxx11::string::compare((char *)pkVar11);
    if (iVar10 == 0) {
      iVar10 = pthread_mutex_lock(local_290);
      if (iVar10 != 0) {
LAB_006834ec:
        std::__throw_system_error(iVar10);
      }
      pbVar17 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&local_2d8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_2b8,pbVar17);
      pvVar14 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>(local_a0,"S");
      vVar1 = pvVar14->m_type;
      pvVar14->m_type = local_2b8.m_type;
      jVar3 = pvVar14->m_value;
      pvVar14->m_value = local_2b8.m_value;
      local_2b8.m_type = vVar1;
      local_2b8.m_value = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_2b8);
      __mutex = local_290;
LAB_0068213d:
      pthread_mutex_unlock(__mutex);
LAB_00682142:
      if ((local_2d8.m_object)->m_type == array) {
        local_2d8.m_it.array_iterator._M_current = local_2d8.m_it.array_iterator._M_current + 1;
      }
      else if ((local_2d8.m_object)->m_type == object) {
        local_2d8.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_2d8.m_it.object_iterator._M_node);
      }
      else {
        local_2d8.m_it.primitive_iterator.m_it = local_2d8.m_it.primitive_iterator.m_it + 1;
      }
      goto LAB_00681e97;
    }
    pkVar11 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::key(&local_2d8);
    iVar10 = std::__cxx11::string::compare((char *)pkVar11);
    if (iVar10 == 0) {
      iVar10 = pthread_mutex_lock(local_298);
      if (iVar10 != 0) goto LAB_006834ec;
      pbVar17 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&local_2d8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>(local_228,pbVar17);
      puVar4 = (this->m_TimeStamps).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->m_TimeStamps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_228._0_8_;
      (this->m_TimeStamps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
      (this->m_TimeStamps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)local_228._16_8_;
      local_228._0_8_ = (reference)0x0;
      local_228._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_228._16_8_ = (_Base_ptr)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      __mutex = local_298;
      if ((reference)local_228._0_8_ != (reference)0x0) {
        operator_delete((void *)local_228._0_8_);
        __mutex = local_298;
      }
      goto LAB_0068213d;
    }
    this->m_CombiningSteps = this->m_CombiningSteps + 1;
    pkVar11 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::key(&local_2d8);
    pbVar17 = (reference)(pkVar11->_M_dataplus)._M_p;
    puVar12 = (uint *)__errno_location();
    uVar2 = *puVar12;
    this = (DataManSerializer *)(ulong)uVar2;
    *puVar12 = 0;
    p_Var13 = (_Hash_node_base *)strtoull((char *)pbVar17,(char **)local_228,10);
    if ((reference)local_228._0_8_ != pbVar17) {
      if (*puVar12 == 0) {
        *puVar12 = uVar2;
      }
      else if (*puVar12 == 0x22) goto LAB_00683506;
      local_300 = p_Var13;
      iVar10 = pthread_mutex_lock(local_288);
      this = local_340;
      if (iVar10 != 0) {
        std::__throw_system_error(iVar10);
      }
      uVar5 = (local_340->m_DeserializedBlocksForStep)._M_h._M_bucket_count;
      uVar27 = (ulong)local_300 % uVar5;
      p_Var6 = (local_340->m_DeserializedBlocksForStep)._M_h._M_buckets[uVar27];
      p_Var15 = (__node_base_ptr)0x0;
      if ((p_Var6 != (__node_base_ptr)0x0) &&
         (p_Var15 = p_Var6, p_Var28 = p_Var6->_M_nxt, local_300 != p_Var6->_M_nxt[1]._M_nxt)) {
        while (p_Var13 = p_Var28->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
          p_Var15 = (__node_base_ptr)0x0;
          if (((ulong)p_Var13[1]._M_nxt % uVar5 != uVar27) ||
             (p_Var15 = p_Var28, p_Var28 = p_Var13, local_300 == p_Var13[1]._M_nxt))
          goto LAB_00682214;
        }
        p_Var15 = (__node_base_ptr)0x0;
      }
LAB_00682214:
      if ((p_Var15 == (__node_base_ptr)0x0) || (p_Var15->_M_nxt == (_Hash_node_base *)0x0)) {
        pmVar16 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_2a0,(key_type *)&local_300);
        *pmVar16 = 1;
      }
      else {
        pmVar16 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_2a0,(key_type *)&local_300);
        *pmVar16 = *pmVar16 + 1;
      }
      pthread_mutex_unlock(local_288);
      pbVar17 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&local_2d8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin(&local_248,pbVar17);
      while( true ) {
        local_228._0_8_ =
             nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_2d8);
        local_228._24_8_ = (pointer)0x8000000000000000;
        local_228._16_8_ = (_Base_ptr)0x0;
        local_228._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if (((reference)local_228._0_8_)->m_type == array) {
          local_228._16_8_ =
               (((((reference)local_228._0_8_)->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
        }
        else if (((reference)local_228._0_8_)->m_type == object) {
          local_228._8_8_ =
               &(((((reference)local_228._0_8_)->m_value).object)->_M_t)._M_impl.
                super__Rb_tree_header;
        }
        else {
          local_228._24_8_ = (pointer)0x1;
        }
        bVar9 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_248,
                           (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_228);
        if (bVar9) break;
        pbVar17 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*(&local_248);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::begin(local_70,pbVar17);
        local_268.m_it.primitive_iterator.m_it = -0x8000000000000000;
        local_268.m_it.array_iterator._M_current = (pointer)0x0;
        local_268.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_268.m_object = pbVar17;
        if (pbVar17->m_type == array) {
          local_268.m_it.array_iterator._M_current =
               (((pbVar17->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
        }
        else if (pbVar17->m_type == object) {
          local_268.m_it.object_iterator._M_node =
               &(((pbVar17->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
        }
        else {
          local_268.m_it.primitive_iterator.m_it = 1;
        }
        while (bVar9 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::
                       operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                 (local_70,&local_268), !bVar9) {
          this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(local_70);
          ppaVar8 = local_78;
          local_228._56_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_228._64_8_ = (_Base_ptr)0x0;
          local_228._40_8_ = (_Base_ptr)0x0;
          local_228._48_8_ = (pointer)0x0;
          local_228._24_8_ = (pointer)0x0;
          local_228._32_8_ = (pointer)0x0;
          local_228._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_228._16_8_ = (_Base_ptr)0x0;
          local_228._72_8_ = (pointer)0x0;
          local_1d8._M_p = (pointer)&local_1c8;
          local_1d0 = 0;
          local_1c8._M_local_buf[0] = '\0';
          local_1b8._M_p = (pointer)&local_1a8;
          local_1b0 = 0;
          local_1a8._M_local_buf[0] = '\0';
          local_78[8] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          ppaVar8[6] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          ppaVar8[7] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          ppaVar8[4] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          ppaVar8[5] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          ppaVar8[2] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          ppaVar8[3] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          *ppaVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
          ppaVar8[1] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          local_128._M_p = (pointer)&local_118;
          local_120 = 0;
          local_118._M_local_buf[0] = '\0';
          local_108._M_p = (pointer)local_80;
          local_100 = 0;
          local_f8._M_local_buf[0] = '\0';
          auStack_e8._8_4_ = _S_red;
          local_d8 = (_Base_ptr)0x0;
          local_d0 = (_Base_ptr)(auStack_e8 + 8);
          local_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c0 = 0;
          peStack_b8 = (element_type *)0x0;
          p_Stack_c8 = local_d0;
          pkVar11 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::key(&local_2d8);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pkVar11->_M_dataplus)._M_p;
          uVar2 = *puVar12;
          *puVar12 = 0;
          uVar18 = strtoull(paVar7->_M_local_buf,(char **)local_378,10);
          if (local_378 == (undefined1  [8])paVar7) {
            uVar25 = std::__throw_invalid_argument("stoull");
LAB_0068356a:
            __cxa_guard_abort(&JsonToVarMap(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,std::shared_ptr<std::vector<char,std::allocator<char>>>)
                               ::__var173);
            _Unwind_Resume(uVar25);
          }
          if (*puVar12 == 0) {
            *puVar12 = uVar2;
          }
          else if (*puVar12 == 0x22) {
            uVar25 = std::__throw_out_of_range("stoull");
            goto LAB_0068356a;
          }
          local_148 = uVar18;
          pvVar19 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_378,pvVar19);
          std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_378);
          if (local_378 != (undefined1  [8])&local_368) {
            operator_delete((void *)local_378);
          }
          pvVar19 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"O");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>
                    (local_378,pvVar19);
          uVar25 = local_228._56_8_;
          local_228._56_8_ = local_378;
          local_228._64_8_ = iStack_370._M_node;
          local_228._72_8_ = local_368._M_allocated_capacity;
          local_378 = (undefined1  [8])0x0;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar25 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)uVar25);
          }
          if (local_378 != (undefined1  [8])0x0) {
            operator_delete((void *)local_378);
          }
          pvVar19 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"C");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>
                    (local_378,pvVar19);
          uVar25 = local_228._32_8_;
          local_228._32_8_ = local_378;
          local_228._40_8_ = iStack_370._M_node;
          local_228._48_8_ = local_368._M_allocated_capacity;
          local_378 = (undefined1  [8])0x0;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          if ((pointer)uVar25 != (pointer)0x0) {
            operator_delete((void *)uVar25);
          }
          if (local_378 != (undefined1  [8])0x0) {
            operator_delete((void *)local_378);
          }
          pvVar19 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"I");
          local_270 = 0;
          nlohmann::detail::
          get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                    (pvVar19,&local_270);
          local_140 = local_270;
          pvVar19 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"Y");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_378,pvVar19);
          local_198 = helper::GetDataTypeFromString((string *)local_378);
          if (local_378 != (undefined1  [8])&local_368) {
            operator_delete((void *)local_378);
          }
          pkVar11 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::key(&local_248);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pkVar11->_M_dataplus)._M_p;
          uVar2 = *puVar12;
          *puVar12 = 0;
          lVar20 = strtol(paVar7->_M_local_buf,(char **)local_378,10);
          this = local_340;
          if (local_378 == (undefined1  [8])paVar7) {
            uVar25 = std::__throw_invalid_argument("stoi");
            goto LAB_0068356a;
          }
          if (((int)lVar20 != lVar20) || (*puVar12 == 0x22)) {
            uVar25 = std::__throw_out_of_range("stoi");
            goto LAB_0068356a;
          }
          if (*puVar12 == 0) {
            *puVar12 = uVar2;
          }
          local_130 = (int)lVar20;
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    (&local_338,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x7512ca);
          local_368._8_8_ = 0x8000000000000000;
          local_368._M_allocated_capacity = 0;
          iStack_370._M_node = (_Base_ptr)0x0;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar9 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar9) {
            pbVar21 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_378,pbVar21);
            std::__cxx11::string::operator=((string *)&local_128,(string *)local_378);
            if (local_378 != (undefined1  [8])&local_368) {
              operator_delete((void *)local_378);
            }
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x7513a3);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          local_368._8_8_ = 0x8000000000000000;
          local_368._M_allocated_capacity = 0;
          iStack_370._M_node = (_Base_ptr)0x0;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar9 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar9) {
            pbVar21 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_378,pbVar21);
            std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_378);
            if (local_378 != (undefined1  [8])&local_368) {
              operator_delete((void *)local_378);
            }
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x74f4f4);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          local_368._8_8_ = 0x8000000000000000;
          local_368._M_allocated_capacity = 0;
          iStack_370._M_node = (_Base_ptr)0x0;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar9 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          sVar26 = (string)0x1;
          if (!bVar9) {
            pbVar21 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            local_378 = (undefined1  [8])((ulong)local_378 & 0xffffffffffffff00);
            nlohmann::detail::
            from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      (pbVar21,(boolean_t *)local_378);
            sVar26 = local_378[0];
          }
          local_228[0] = sVar26;
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x750f60);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          local_368._8_8_ = 0x8000000000000000;
          local_368._M_allocated_capacity = 0;
          iStack_370._M_node = (_Base_ptr)0x0;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar9 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (bVar9) {
            local_228[1] = true;
          }
          else {
            pbVar21 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            local_378 = (undefined1  [8])((ulong)local_378 & 0xffffffffffffff00);
            nlohmann::detail::
            from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      (pbVar21,(boolean_t *)local_378);
            local_228[1] = local_378[0];
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x76b62b);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          local_368._8_8_ = 0x8000000000000000;
          local_368._M_allocated_capacity = 0;
          iStack_370._M_node = (_Base_ptr)0x0;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar9 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar9) {
            pbVar21 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>
                      (local_378,pbVar21);
            uVar25 = local_228._8_8_;
            local_228._8_8_ = local_378;
            local_228._16_8_ = iStack_370._M_node;
            local_228._24_8_ = local_368._M_allocated_capacity;
            local_378 = (undefined1  [8])0x0;
            iStack_370._M_node = (_Base_ptr)0x0;
            local_368._M_allocated_capacity = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar25 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)uVar25);
            }
            if (local_378 != (undefined1  [8])0x0) {
              operator_delete((void *)local_378);
            }
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x753fc3);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          local_368._8_8_ = 0x8000000000000000;
          local_368._M_allocated_capacity = 0;
          iStack_370._M_node = (_Base_ptr)0x0;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar9 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar9) {
            pbVar21 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<std::vector<char,_std::allocator<char>_>,_0>(local_378,pbVar21);
            paVar7 = paStack_178;
            paStack_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_378;
            local_170 = iStack_370._M_node;
            pbStack_168 = (pointer)local_368._M_allocated_capacity;
            local_378 = (undefined1  [8])0x0;
            iStack_370._M_node = (_Base_ptr)0x0;
            local_368._M_allocated_capacity = 0;
            if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
              operator_delete(paVar7);
            }
            if (local_378 != (undefined1  [8])0x0) {
              operator_delete((void *)local_378);
            }
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x76b966);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          local_368._8_8_ = 0x8000000000000000;
          local_368._M_allocated_capacity = 0;
          iStack_370._M_node = (_Base_ptr)0x0;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar9 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar9) {
            pbVar21 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<std::vector<char,_std::allocator<char>_>,_0>(local_378,pbVar21);
            paVar7 = local_190;
            local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_378;
            p_Stack_188 = iStack_370._M_node;
            local_180 = (pointer)local_368._M_allocated_capacity;
            local_378 = (undefined1  [8])0x0;
            iStack_370._M_node = (_Base_ptr)0x0;
            local_368._M_allocated_capacity = 0;
            if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
              operator_delete(paVar7);
            }
            if (local_378 != (undefined1  [8])0x0) {
              operator_delete((void *)local_378);
            }
          }
          pvVar19 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"P");
          local_378 = (undefined1  [8])0x0;
          nlohmann::detail::
          get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                    (pvVar19,(unsigned_long *)local_378);
          local_138 = (char *)local_378;
          peStack_b8 = (local_280->
                       super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_b0,local_88);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    (&local_2f8,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])"Z");
          local_368._8_8_ = 0x8000000000000000;
          local_368._M_allocated_capacity = 0;
          iStack_370._M_node = (_Base_ptr)0x0;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar9 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_2f8,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar9) {
            pbVar21 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_2f8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_378,pbVar21);
            std::__cxx11::string::operator=((string *)&local_108,(string *)local_378);
            if (local_378 != (undefined1  [8])&local_368) {
              operator_delete((void *)local_378);
            }
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[3]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [3])"ZP");
          local_2f8.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_2f8.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_2f8.m_object = (pointer)local_378;
          local_2f8.m_it.object_iterator._M_node = iStack_370._M_node;
          local_368._8_8_ = (iterator *)0x8000000000000000;
          local_368._M_allocated_capacity = 0;
          iStack_370._M_node = (_Base_ptr)0x0;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = (iterator *)0x1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar9 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_2f8,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar9) {
            pbVar21 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_2f8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                      (local_378,pbVar21);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::clear(local_90);
            if ((pointer)local_368._M_allocated_capacity != (pointer)0x0) {
              auStack_e8._8_4_ = (_Rb_tree_color)iStack_370._M_node;
              local_d8 = (_Base_ptr)local_368._M_allocated_capacity;
              local_d0 = (_Base_ptr)local_368._8_8_;
              p_Stack_c8 = local_358;
              ((json_value *)(local_368._M_allocated_capacity + 8))->object =
                   (object_t *)(auStack_e8 + 8);
              local_c0 = local_350;
              local_368._M_allocated_capacity = 0;
              local_350 = 0;
              local_368._8_8_ = (_Base_ptr)&iStack_370;
              local_358 = (_Base_ptr)&iStack_370;
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_378);
          }
          pmVar22 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_308,&local_148);
          if ((pmVar22->
              super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr == (element_type *)0x0) {
            p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
            p_Var23->_M_use_count = 1;
            p_Var23->_M_weak_count = 1;
            p_Var23->_vptr__Sp_counted_base = local_98;
            p_Var23[1]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var23[1]._M_use_count = 0;
            p_Var23[1]._M_weak_count = 0;
            p_Var23[2]._vptr__Sp_counted_base = (_func_int **)0x0;
            pmVar22 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_308,&local_148);
            (pmVar22->
            super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr = (element_type *)(p_Var23 + 1);
            this_00 = (pmVar22->
                      super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount._M_pi;
            (pmVar22->
            super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi = p_Var23;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
          }
          pmVar22 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_308,&local_148);
          std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>::
          emplace_back<adios2::format::DataManVar>
                    ((pmVar22->
                     super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr,(DataManVar *)local_228);
          DataManVar::~DataManVar((DataManVar *)local_228);
          if ((local_70[0].m_object)->m_type == array) {
            local_70[0].m_it.array_iterator._M_current =
                 local_70[0].m_it.array_iterator._M_current + 1;
          }
          else if ((local_70[0].m_object)->m_type == object) {
            local_70[0].m_it.object_iterator._M_node =
                 (_Base_ptr)std::_Rb_tree_increment(local_70[0].m_it.object_iterator._M_node);
          }
          else {
            local_70[0].m_it.primitive_iterator.m_it = local_70[0].m_it.primitive_iterator.m_it + 1;
          }
        }
        if ((local_248.m_object)->m_type == array) {
          local_248.m_it.array_iterator._M_current = local_248.m_it.array_iterator._M_current + 1;
        }
        else if ((local_248.m_object)->m_type == object) {
          local_248.m_it.object_iterator._M_node =
               (_Base_ptr)std::_Rb_tree_increment(local_248.m_it.object_iterator._M_node);
        }
        else {
          local_248.m_it.primitive_iterator.m_it = local_248.m_it.primitive_iterator.m_it + 1;
        }
      }
      goto LAB_00682142;
    }
    std::__throw_invalid_argument("stoull");
LAB_00683506:
    std::__throw_out_of_range("stoull");
LAB_00683512:
    iVar10 = __cxa_guard_acquire(&JsonToVarMap(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,std::shared_ptr<std::vector<char,std::allocator<char>>>)
                                  ::__var173);
    if (iVar10 != 0) {
      uVar25 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                   ,
                                   "void adios2::format::DataManSerializer::JsonToVarMap(nlohmann::json &, VecPtr)"
                                   ,0xad);
      JsonToVarMap::__var173 = (void *)ps_timer_create_(uVar25);
      __cxa_guard_release(&JsonToVarMap(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,std::shared_ptr<std::vector<char,std::allocator<char>>>)
                           ::__var173);
      this = local_340;
    }
  } while( true );
}

Assistant:

void DataManSerializer::JsonToVarMap(nlohmann::json &metaJ, VecPtr pack)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    // the mutex has to be locked here through the entire function. Otherwise
    // reader engine could get incomplete step metadata. This function only
    // deals with JSON metadata and data buffer already in allocated shared
    // pointers, so it should be cheap to lock.
    std::lock_guard<std::mutex> lDataManVarMapMutex(m_DataManVarMapMutex);

    m_CombiningSteps = 0;

    for (auto stepMapIt = metaJ.begin(); stepMapIt != metaJ.end(); ++stepMapIt)
    {
        if (stepMapIt.key() == "S")
        {
            m_StaticDataJsonMutex.lock();
            m_StaticDataJson["S"] = stepMapIt.value();
            m_StaticDataJsonMutex.unlock();
            continue;
        }
        if (stepMapIt.key() == "T")
        {
            m_TimeStampsMutex.lock();
            m_TimeStamps = stepMapIt.value().get<std::vector<uint64_t>>();
            m_TimeStampsMutex.unlock();
            continue;
        }

        ++m_CombiningSteps;
        size_t step = stoull(stepMapIt.key());
        m_DeserializedBlocksForStepMutex.lock();
        auto blocksForStepIt = m_DeserializedBlocksForStep.find(step);
        if (blocksForStepIt == m_DeserializedBlocksForStep.end())
        {
            m_DeserializedBlocksForStep[step] = 1;
        }
        else
        {
            ++m_DeserializedBlocksForStep[step];
        }
        m_DeserializedBlocksForStepMutex.unlock();

        for (auto rankMapIt = stepMapIt.value().begin(); rankMapIt != stepMapIt.value().end();
             ++rankMapIt)
        {
            for (const auto &varBlock : rankMapIt.value())
            {
                DataManVar var;
                try
                {
                    // compulsory properties
                    var.step = stoull(stepMapIt.key());
                    var.name = varBlock["N"].get<std::string>();
                    var.start = varBlock["O"].get<Dims>();
                    var.count = varBlock["C"].get<Dims>();
                    var.size = varBlock["I"].get<size_t>();
                    var.type = helper::GetDataTypeFromString(varBlock["Y"].get<std::string>());
                    var.rank = stoi(rankMapIt.key());
                }
                catch (std::exception &e)
                {
                    helper::Throw<std::runtime_error>(
                        "Toolkit::Format", "dataman::DataManSerializer", "JsonToVarMap",
                        "missing compulsory properties in JSON metadata");
                }

                // optional properties

                auto itJson = varBlock.find("A");
                if (itJson != varBlock.end())
                {
                    var.address = itJson->get<std::string>();
                }

                itJson = varBlock.find("D");
                if (itJson != varBlock.end())
                {
                    var.doid = itJson->get<std::string>();
                }

                itJson = varBlock.find("M");
                if (itJson != varBlock.end())
                {
                    var.isRowMajor = itJson->get<bool>();
                }
                else
                {
                    var.isRowMajor = true;
                }

                itJson = varBlock.find("E");
                if (itJson != varBlock.end())
                {
                    var.isLittleEndian = itJson->get<bool>();
                }
                else
                {
                    var.isLittleEndian = true;
                }

                itJson = varBlock.find("S");
                if (itJson != varBlock.end())
                {
                    var.shape = itJson->get<Dims>();
                }

                itJson = varBlock.find("+");
                if (itJson != varBlock.end())
                {
                    var.max = itJson->get<std::vector<char>>();
                }

                itJson = varBlock.find("-");
                if (itJson != varBlock.end())
                {
                    var.min = itJson->get<std::vector<char>>();
                }

                var.position = varBlock["P"].get<size_t>();
                var.buffer = pack;

                auto it = varBlock.find("Z");
                if (it != varBlock.end())
                {
                    var.compression = it->get<std::string>();
                }

                it = varBlock.find("ZP");
                if (it != varBlock.end())
                {
                    var.params = it->get<Params>();
                }

                if (m_DataManVarMap[var.step] == nullptr)
                {
                    m_DataManVarMap[var.step] = std::make_shared<std::vector<DataManVar>>();
                }
                m_DataManVarMap[var.step]->emplace_back(std::move(var));
            }
        }
    }
    if (m_Verbosity >= 5)
    {
        std::cout << "DataManSerializer::JsonToVarMap Total buffered steps = "
                  << m_DataManVarMap.size() << ": ";
        for (const auto &i : m_DataManVarMap)
        {
            std::cout << i.first << ", ";
        }
        std::cout << std::endl;
    }
}